

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O0

void __thiscall Assimp::Blender::DNA::AddPrimitiveStructures(DNA *this)

{
  size_type sVar1;
  mapped_type_conflict3 *pmVar2;
  reference pvVar3;
  vector<Assimp::Blender::Structure> *pvVar4;
  Structure local_340;
  allocator local_2c1;
  key_type local_2c0;
  Structure local_2a0;
  allocator local_221;
  key_type local_220;
  Structure local_200;
  allocator local_181;
  key_type local_180;
  Structure local_160;
  allocator local_e1;
  key_type local_e0;
  Structure local_c0;
  allocator local_31;
  key_type local_30;
  DNA *local_10;
  DNA *this_local;
  
  local_10 = this;
  sVar1 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
          size(&(this->structures).
                super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
              );
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_30,"int",&local_31);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](&this->indices,&local_30);
  *pmVar2 = sVar1;
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  Structure::Structure(&local_c0);
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::push_back
            (&(this->structures).
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             &local_c0);
  Structure::~Structure(&local_c0);
  pvVar4 = &this->structures;
  pvVar3 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
           back(&pvVar4->
                 super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               );
  ::std::__cxx11::string::operator=((string *)pvVar3,"int");
  pvVar3 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
           back(&pvVar4->
                 super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               );
  pvVar3->size = 4;
  sVar1 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
          size(&pvVar4->
                super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
              );
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_e0,"short",&local_e1);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](&this->indices,&local_e0);
  *pmVar2 = sVar1;
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  Structure::Structure(&local_160);
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::push_back
            (&(this->structures).
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             &local_160);
  Structure::~Structure(&local_160);
  pvVar4 = &this->structures;
  pvVar3 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
           back(&pvVar4->
                 super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               );
  ::std::__cxx11::string::operator=((string *)pvVar3,"short");
  pvVar3 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
           back(&pvVar4->
                 super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               );
  pvVar3->size = 2;
  sVar1 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
          size(&pvVar4->
                super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
              );
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_180,"char",&local_181);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](&this->indices,&local_180);
  *pmVar2 = sVar1;
  ::std::__cxx11::string::~string((string *)&local_180);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_181);
  Structure::Structure(&local_200);
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::push_back
            (&(this->structures).
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             &local_200);
  Structure::~Structure(&local_200);
  pvVar4 = &this->structures;
  pvVar3 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
           back(&pvVar4->
                 super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               );
  ::std::__cxx11::string::operator=((string *)pvVar3,"char");
  pvVar3 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
           back(&pvVar4->
                 super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               );
  pvVar3->size = 1;
  sVar1 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
          size(&pvVar4->
                super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
              );
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_220,"float",&local_221);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](&this->indices,&local_220);
  *pmVar2 = sVar1;
  ::std::__cxx11::string::~string((string *)&local_220);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_221);
  Structure::Structure(&local_2a0);
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::push_back
            (&(this->structures).
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             &local_2a0);
  Structure::~Structure(&local_2a0);
  pvVar4 = &this->structures;
  pvVar3 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
           back(&pvVar4->
                 super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               );
  ::std::__cxx11::string::operator=((string *)pvVar3,"float");
  pvVar3 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
           back(&pvVar4->
                 super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               );
  pvVar3->size = 4;
  sVar1 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
          size(&pvVar4->
                super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
              );
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_2c0,"double",&local_2c1);
  pmVar2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](&this->indices,&local_2c0);
  *pmVar2 = sVar1;
  ::std::__cxx11::string::~string((string *)&local_2c0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  Structure::Structure(&local_340);
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::push_back
            (&(this->structures).
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             &local_340);
  Structure::~Structure(&local_340);
  pvVar3 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
           back(&(this->structures).
                 super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               );
  ::std::__cxx11::string::operator=((string *)pvVar3,"double");
  pvVar3 = ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
           back(&(this->structures).
                 super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
               );
  pvVar3->size = 8;
  return;
}

Assistant:

void DNA :: AddPrimitiveStructures()
{
    // NOTE: these are just dummies. Their presence enforces
    // Structure::Convert<target_type> to be called on these
    // empty structures. These converters are special
    // overloads which scan the name of the structure and
    // perform the required data type conversion if one
    // of these special names is found in the structure
    // in question.

    indices["int"] = structures.size();
    structures.push_back( Structure() );
    structures.back().name = "int";
    structures.back().size = 4;

    indices["short"] = structures.size();
    structures.push_back( Structure() );
    structures.back().name = "short";
    structures.back().size = 2;


    indices["char"] = structures.size();
    structures.push_back( Structure() );
    structures.back().name = "char";
    structures.back().size = 1;


    indices["float"] = structures.size();
    structures.push_back( Structure() );
    structures.back().name = "float";
    structures.back().size = 4;


    indices["double"] = structures.size();
    structures.push_back( Structure() );
    structures.back().name = "double";
    structures.back().size = 8;

    // no long, seemingly.
}